

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::NotEqualTest<short,signed_char>(void)

{
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_33;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_32;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_30;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2e;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2c;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2a;
  int local_28 [6];
  
  local_28[5] = 3;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_2a,local_28 + 5);
  if (local_2a.m_int != 2) {
    local_28[4] = 4;
    SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_2c,local_28 + 4);
    if (local_2c.m_int != 5) {
      local_28[3] = 6;
      SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_2e,local_28 + 3);
      local_28[2] = 7;
      SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_33,local_28 + 2);
      if (local_2e.m_int != local_33.m_int) {
        local_28[1] = 1;
        SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                  (&local_30,local_28 + 1);
        if (local_30.m_int == 0) {
          local_28[0] = 0;
          SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                    (&local_32,local_28);
          return local_32.m_int != 0;
        }
      }
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}